

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_list_to_vector_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp psVar1;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  sexp in_RDI;
  bool bVar2;
  sexp vec;
  sexp_conflict *elts;
  sexp x;
  int i;
  sexp in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar3;
  
  sexp_length_op(in_RDI,(sexp)0x0,1,in_RCX);
  psVar1 = sexp_make_vector_op(in_RSI,in_RDX,(sexp_sint_t)in_RCX,
                               (sexp)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffc8);
  if ((((ulong)psVar1 & 3) != 0) || (psVar1->tag != 0x13)) {
    iVar3 = 0;
    while( true ) {
      bVar2 = false;
      if (((ulong)in_RCX & 3) == 0) {
        bVar2 = in_RCX->tag == 6;
      }
      if (!bVar2) break;
      *(double *)((long)&psVar1->value + (long)iVar3 * 8 + 8) = (in_RCX->value).flonum;
      iVar3 = iVar3 + 1;
      in_RCX = (in_RCX->value).type.cpl;
    }
  }
  return psVar1;
}

Assistant:

sexp sexp_list_to_vector_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  int i;
  sexp x, *elts, vec = sexp_make_vector(ctx, sexp_length(ctx, ls), SEXP_VOID);
  if (sexp_exceptionp(vec)) return vec;
  elts = sexp_vector_data(vec);
  for (i=0, x=ls; sexp_pairp(x); i++, x=sexp_cdr(x))
    elts[i] = sexp_car(x);
  return vec;
}